

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.c
# Opt level: O1

int insert_at(quicly_ranges_t *ranges,uint64_t start,uint64_t end,size_t slot)

{
  ulong uVar1;
  ulong uVar2;
  quicly_range_t *pqVar3;
  size_t _n;
  size_t sVar4;
  
  uVar1 = ranges->num_ranges;
  uVar2 = ranges->capacity;
  if (uVar1 == uVar2) {
    sVar4 = 4;
    if (3 < uVar2) {
      sVar4 = uVar2 * 2;
    }
    pqVar3 = (quicly_range_t *)malloc(sVar4 << 4);
    if (pqVar3 == (quicly_range_t *)0x0) {
      return 0x201;
    }
    if (slot != 0) {
      memcpy(pqVar3,ranges->ranges,slot << 4);
    }
    if (uVar1 - slot != 0) {
      memcpy(pqVar3 + slot + 1,ranges->ranges + slot,(uVar1 - slot) * 0x10);
    }
    if (ranges->ranges != &ranges->_initial) {
      free(ranges->ranges);
    }
    ranges->ranges = pqVar3;
    ranges->capacity = sVar4;
    if (pqVar3 == (quicly_range_t *)0x0) {
      return 0x201;
    }
  }
  else if (uVar1 - slot != 0) {
    memmove(ranges->ranges + slot + 1,ranges->ranges + slot,(uVar1 - slot) * 0x10);
  }
  pqVar3 = ranges->ranges;
  pqVar3[slot].start = start;
  pqVar3[slot].end = end;
  ranges->num_ranges = ranges->num_ranges + 1;
  return 0;
}

Assistant:

static int insert_at(quicly_ranges_t *ranges, uint64_t start, uint64_t end, size_t slot)
{
    if (ranges->num_ranges == ranges->capacity) {
        size_t new_capacity = ranges->capacity < 4 ? 4 : ranges->capacity * 2;
        quicly_range_t *new_ranges = malloc(new_capacity * sizeof(*new_ranges));
        if (new_ranges == NULL)
            return PTLS_ERROR_NO_MEMORY;
        COPY(new_ranges, ranges->ranges, slot);
        COPY(new_ranges + slot + 1, ranges->ranges + slot, ranges->num_ranges - slot);
        if (ranges->ranges != &ranges->_initial)
            free(ranges->ranges);
        ranges->ranges = new_ranges;
        ranges->capacity = new_capacity;
    } else {
        MOVE(ranges->ranges + slot + 1, ranges->ranges + slot, ranges->num_ranges - slot);
    }
    ranges->ranges[slot] = (quicly_range_t){start, end};
    ++ranges->num_ranges;
    return 0;
}